

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5CursorFirstSorted(Fts5FullTable *pTab,Fts5Cursor *pCsr,int bDesc)

{
  Fts5Config *pConfig_00;
  undefined8 uVar1;
  int iVar2;
  Fts5Cursor *ppStmt;
  char *pcVar3;
  char *pcVar4;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  char *zRankArgs;
  char *zRank;
  int rc;
  sqlite3_int64 nByte;
  int nPhrase;
  Fts5Sorter *pSorter;
  Fts5Config *pConfig;
  sqlite3_uint64 in_stack_ffffffffffffff38;
  sqlite3_stmt *local_a8;
  Fts5Cursor *pCsr_00;
  int local_54;
  int local_14;
  
  pConfig_00 = *(Fts5Config **)(in_RDI + 0x18);
  uVar1 = *(undefined8 *)(in_RSI + 0x60);
  local_a8 = *(sqlite3_stmt **)(in_RSI + 0x68);
  iVar2 = sqlite3Fts5ExprPhraseCount(*(Fts5Expr **)(in_RSI + 0x40));
  ppStmt = (Fts5Cursor *)sqlite3_malloc64(in_stack_ffffffffffffff38);
  if (ppStmt == (Fts5Cursor *)0x0) {
    local_14 = 7;
  }
  else {
    memset(ppStmt,0,(long)(iVar2 + -1) * 4 + 0x20);
    *(int *)&ppStmt->iCsrId = iVar2;
    pcVar3 = "";
    if (local_a8 == (sqlite3_stmt *)0x0) {
      local_a8 = (sqlite3_stmt *)0x2b52e8;
    }
    else {
      pcVar3 = ", ";
    }
    pcVar4 = "ASC";
    if (in_EDX != 0) {
      pcVar4 = "DESC";
    }
    pCsr_00 = ppStmt;
    local_54 = fts5PrepareStatement
                         ((sqlite3_stmt **)ppStmt,pConfig_00,
                          "SELECT rowid, rank FROM %Q.%Q ORDER BY %s(\"%w\"%s%s) %s",pConfig_00->zDb
                          ,pConfig_00->zName,uVar1,pConfig_00->zName,pcVar3,local_a8,pcVar4);
    *(Fts5Cursor **)(in_RSI + 0x48) = ppStmt;
    if (local_54 == 0) {
      *(long *)(in_RDI + 0x38) = in_RSI;
      local_54 = fts5SorterNext(pCsr_00);
      *(undefined8 *)(in_RDI + 0x38) = 0;
    }
    if (local_54 != 0) {
      sqlite3_finalize(local_a8);
      sqlite3_free((void *)0x26c8f4);
      *(undefined8 *)(in_RSI + 0x48) = 0;
    }
    local_14 = local_54;
  }
  return local_14;
}

Assistant:

static int fts5CursorFirstSorted(
  Fts5FullTable *pTab,
  Fts5Cursor *pCsr,
  int bDesc
){
  Fts5Config *pConfig = pTab->p.pConfig;
  Fts5Sorter *pSorter;
  int nPhrase;
  sqlite3_int64 nByte;
  int rc;
  const char *zRank = pCsr->zRank;
  const char *zRankArgs = pCsr->zRankArgs;

  nPhrase = sqlite3Fts5ExprPhraseCount(pCsr->pExpr);
  nByte = sizeof(Fts5Sorter) + sizeof(int) * (nPhrase-1);
  pSorter = (Fts5Sorter*)sqlite3_malloc64(nByte);
  if( pSorter==0 ) return SQLITE_NOMEM;
  memset(pSorter, 0, (size_t)nByte);
  pSorter->nIdx = nPhrase;

  /* TODO: It would be better to have some system for reusing statement
  ** handles here, rather than preparing a new one for each query. But that
  ** is not possible as SQLite reference counts the virtual table objects.
  ** And since the statement required here reads from this very virtual
  ** table, saving it creates a circular reference.
  **
  ** If SQLite a built-in statement cache, this wouldn't be a problem. */
  rc = fts5PrepareStatement(&pSorter->pStmt, pConfig,
      "SELECT rowid, rank FROM %Q.%Q ORDER BY %s(\"%w\"%s%s) %s",
      pConfig->zDb, pConfig->zName, zRank, pConfig->zName,
      (zRankArgs ? ", " : ""),
      (zRankArgs ? zRankArgs : ""),
      bDesc ? "DESC" : "ASC"
  );

  pCsr->pSorter = pSorter;
  if( rc==SQLITE_OK ){
    assert( pTab->pSortCsr==0 );
    pTab->pSortCsr = pCsr;
    rc = fts5SorterNext(pCsr);
    pTab->pSortCsr = 0;
  }

  if( rc!=SQLITE_OK ){
    sqlite3_finalize(pSorter->pStmt);
    sqlite3_free(pSorter);
    pCsr->pSorter = 0;
  }

  return rc;
}